

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall
QItemSelectionModel::isRowSelected(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  anon_class_16_2_2e6992c7_for__M_pred __pred;
  anon_class_16_2_e007c01b_for__M_pred __pred_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  parameter_type pQVar5;
  QAbstractItemModel *pQVar6;
  QItemSelectionRange *selection_00;
  arrow_operator_result ppQVar7;
  const_iterator __first;
  back_insert_iterator<std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
  __last;
  back_insert_iterator<std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
  __result;
  reference this_00;
  QModelIndex *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  int i;
  int right;
  QItemSelectionRangeRefCache *curSel;
  vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *__range2_1;
  bool foundSelection;
  int column;
  int unselectable;
  int colCount;
  QItemSelectionRange *selection;
  QItemSelection *__range2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> cache;
  anon_class_16_2_e4a7c93d isSelectable;
  anon_class_1_0_00000001 intersects;
  const_iterator __end2;
  const_iterator __begin2;
  anon_class_1_0_00000001 matches;
  QItemSelectionModelPrivate *d;
  undefined4 in_stack_fffffffffffffe28;
  SelectionFlag in_stack_fffffffffffffe2c;
  QModelIndex *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 in_stack_fffffffffffffe50;
  back_insert_iterator<std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
  in_stack_fffffffffffffe58;
  const_iterator in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  int local_170;
  int local_154;
  int local_100;
  bool local_89;
  __normal_iterator<QItemSelectionRangeRefCache_*,_std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
  local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QItemSelectionModelPrivate **local_58;
  undefined1 local_39;
  QItemSelectionRange *local_38;
  const_iterator local_30;
  const_iterator local_28;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_1c;
  __0 local_15;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_14;
  QItemSelectionModelPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = d_func((QItemSelectionModel *)0x82d6c0);
  pQVar5 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                    *)in_stack_fffffffffffffe30);
  if (pQVar5 == (parameter_type)0x0) {
    local_89 = false;
  }
  else {
    bVar1 = QModelIndex::isValid(in_stack_fffffffffffffe30);
    if (bVar1) {
      pQVar5 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                         ((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                           *)0x82d710);
      pQVar6 = QModelIndex::model((QModelIndex *)0x82d722);
      if (pQVar5 != pQVar6) {
        local_89 = false;
        goto LAB_0082de7b;
      }
    }
    local_14.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe2c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) {
      local_15 = (__0)0xaa;
      QList<QItemSelectionRange>::cbegin((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
      QList<QItemSelectionRange>::cend((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
      const::$_0::operator()(&local_15,in_ESI,in_RDX);
      __pred.parent = (QModelIndex *)in_stack_fffffffffffffe58.container;
      __pred._0_8_ = in_stack_fffffffffffffe50;
      bVar1 = std::operator()(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,__pred);
      if (bVar1) {
        local_89 = false;
        goto LAB_0082de7b;
      }
    }
    local_1c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe30,
                    in_stack_fffffffffffffe2c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    if (bVar1) {
      local_28.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
      local_30.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
      while( true ) {
        local_38 = local_30.i;
        bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_28,local_30);
        if (!bVar1) break;
        selection_00 = QList<QItemSelectionRange>::const_iterator::operator*(&local_28);
        iVar3 = QItemSelectionRange::top((QItemSelectionRange *)0x82d92e);
        if ((iVar3 <= in_ESI) &&
           (iVar3 = QItemSelectionRange::bottom((QItemSelectionRange *)0x82d954), in_ESI <= iVar3))
        {
          local_39 = 0xaa;
          QList<QItemSelectionRange>::cbegin
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
          QList<QItemSelectionRange>::cend((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
          const::$_1::operator()(&local_39,in_ESI,selection_00);
          __pred_00.selection = (QItemSelectionRange *)in_stack_fffffffffffffe58.container;
          __pred_00._0_8_ = in_stack_fffffffffffffe50;
          bVar1 = std::operator()(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,__pred_00);
          if (bVar1) {
            local_89 = false;
            goto LAB_0082de7b;
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_28);
      }
    }
    local_58 = &local_10;
    ppQVar7 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffe30);
    iVar3 = (*((*ppQVar7)->super_QObject)._vptr_QObject[0x10])(*ppQVar7,in_RDX);
    local_100 = 0;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::vector
              ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               0x82dabd);
    __first.i = (QItemSelectionRange *)
                QList<QItemSelectionRange>::size
                          (&(local_10->currentSelection).super_QList<QItemSelectionRange>);
    QList<QItemSelectionRange>::size(&(local_10->ranges).super_QList<QItemSelectionRange>);
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::reserve
              ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               in_stack_fffffffffffffe60.i,(size_type)in_stack_fffffffffffffe58.container);
    QList<QItemSelectionRange>::begin((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
    __last = std::
             back_inserter<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>
                       ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                         *)in_stack_fffffffffffffe30);
    __result = std::
               copy<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
                         (__first,(const_iterator)__last.container,in_stack_fffffffffffffe58);
    QList<QItemSelectionRange>::begin((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)in_stack_fffffffffffffe30);
    std::
    back_inserter<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>
              ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               in_stack_fffffffffffffe30);
    std::
    copy<QList<QItemSelectionRange>::const_iterator,std::back_insert_iterator<std::vector<QItemSelectionRangeRefCache,std::allocator<QItemSelectionRangeRefCache>>>>
              (__first,(const_iterator)__last.container,__result);
    for (local_154 = 0; local_154 < iVar3; local_154 = local_154 + 1) {
      in_stack_fffffffffffffe47 =
           isRowSelected::anon_class_16_2_e4a7c93d::operator()
                     ((anon_class_16_2_e4a7c93d *)
                      CONCAT17(in_stack_fffffffffffffe47,
                               CONCAT16(in_stack_fffffffffffffe46,
                                        CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ))),in_stack_fffffffffffffe3c,
                      in_stack_fffffffffffffe38);
      if ((bool)in_stack_fffffffffffffe47) {
        bVar1 = false;
        local_80._M_current = (QItemSelectionRangeRefCache *)&DAT_aaaaaaaaaaaaaaaa;
        local_80._M_current =
             (QItemSelectionRangeRefCache *)
             std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
             ::begin((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                      *)in_stack_fffffffffffffe30);
        std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::end
                  ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>
                    *)in_stack_fffffffffffffe30);
LAB_0082dcf9:
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<QItemSelectionRangeRefCache_*,_std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
                            *)in_stack_fffffffffffffe30,
                           (__normal_iterator<QItemSelectionRangeRefCache_*,_std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if (bVar2) {
          this_00 = __gnu_cxx::
                    __normal_iterator<QItemSelectionRangeRefCache_*,_std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
                    ::operator*(&local_80);
          in_stack_fffffffffffffe46 =
               QItemSelectionRangeRefCache::contains
                         ((QItemSelectionRangeRefCache *)
                          CONCAT17(in_stack_fffffffffffffe47,
                                   CONCAT16(in_stack_fffffffffffffe46,
                                            CONCAT24(in_stack_fffffffffffffe44,
                                                     in_stack_fffffffffffffe40))),
                          in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                          in_stack_fffffffffffffe30);
          if (!(bool)in_stack_fffffffffffffe46) goto LAB_0082de06;
          iVar4 = QItemSelectionRangeRefCache::right(this_00);
          in_stack_fffffffffffffe40 = iVar4;
          while (local_170 = local_154 + 1, local_170 <= iVar4) {
            bVar1 = isRowSelected::anon_class_16_2_e4a7c93d::operator()
                              ((anon_class_16_2_e4a7c93d *)
                               CONCAT17(in_stack_fffffffffffffe47,
                                        CONCAT16(in_stack_fffffffffffffe46,
                                                 CONCAT24(in_stack_fffffffffffffe44,
                                                          in_stack_fffffffffffffe40))),
                               in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
            in_stack_fffffffffffffe3c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe3c);
            local_154 = local_170;
            if (!bVar1) {
              local_100 = local_100 + 1;
            }
          }
          bVar1 = true;
          QItemSelectionRangeRefCache::invalidate(this_00);
          local_154 = iVar4;
        }
        if (bVar1) goto LAB_0082de36;
        local_89 = false;
        goto LAB_0082de6e;
      }
      local_100 = local_100 + 1;
LAB_0082de36:
    }
    local_89 = local_100 < iVar3;
LAB_0082de6e:
    std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>::~vector
              ((vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_> *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT24(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))));
  }
LAB_0082de7b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
LAB_0082de06:
  __gnu_cxx::
  __normal_iterator<QItemSelectionRangeRefCache_*,_std::vector<QItemSelectionRangeRefCache,_std::allocator<QItemSelectionRangeRefCache>_>_>
  ::operator++(&local_80);
  goto LAB_0082dcf9;
}

Assistant:

bool QItemSelectionModel::isRowSelected(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
        return false;

    // return false if row exist in currentSelection (Deselect)
    if (d->currentCommand & Deselect) {
        const auto matches = [](auto row, const auto &parent) {
            return [row, &parent](const auto &selection) {
                return row >= selection.top() &&
                       row <= selection.bottom() &&
                       parent == selection.parent();
            };
        };
        if (std::any_of(d->currentSelection.cbegin(), d->currentSelection.cend(), matches(row, parent)))
            return false;
    }
    // return false if ranges in both currentSelection and ranges
    // intersect and have the same row contained
    if (d->currentCommand & Toggle) {
        for (const auto &selection : d->currentSelection) {
            if (row >= selection.top() && row <= selection.bottom()) {
                const auto intersects = [](auto row, const auto &selection) {
                    return [row, &selection](const auto &range) {
                        return row >= range.top() &&
                               row <= range.bottom() &&
                               selection.intersected(range).isValid();
                    };
                };
                if (std::any_of(d->ranges.cbegin(), d->ranges.cend(), intersects(row, selection)))
                    return false;
            }
        }
    }

    auto isSelectable = [&](int row, int column) {
        return isSelectableAndEnabled(d->model->index(row, column, parent).flags());
    };

    const int colCount = d->model->columnCount(parent);
    int unselectable = 0;
    std::vector<QItemSelectionRangeRefCache> cache;
    cache.reserve(d->currentSelection.size() + d->ranges.size());
    std::copy(d->currentSelection.begin(), d->currentSelection.end(), std::back_inserter(cache));
    std::copy(d->ranges.begin(), d->ranges.end(), std::back_inserter(cache));

    // check ranges and currentSelection
    for (int column = 0; column < colCount; ++column) {
        if (!isSelectable(row, column)) {
            ++unselectable;
            continue;
        }
        bool foundSelection = false;
        for (auto &curSel : cache) {
            if (curSel.contains(row, column, parent)) {
                const auto right = curSel.right();
                for (int i = column + 1; i <= right; ++i) {
                    if (!isSelectable(row, i))
                        ++unselectable;
                }
                column = right;
                foundSelection = true;
                curSel.invalidate();
                break;
            }
        }
        if (!foundSelection)
            return false;
    }
    return unselectable < colCount;
}